

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::
     TupleMatches<std::tuple<testing::Matcher<(anonymous_namespace)::SerializeSpanFallback::simple_struct_const&>>,std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_const&>>
               (tuple<testing::Matcher<const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_>
                *matcher_tuple,
               tuple<const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
               *value_tuple)

{
  bool bVar1;
  MatchResultListener local_10;
  
  local_10.stream_ = (ostream *)0x0;
  local_10._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00186508;
  bVar1 = MatcherBase<const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>::
          MatchAndExplain((MatcherBase<const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
                           *)matcher_tuple,
                          (value_tuple->
                          super__Tuple_impl<0UL,_const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
                          ).
                          super__Head_base<0UL,_const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&,_false>
                          ._M_head_impl,&local_10);
  return bVar1;
}

Assistant:

bool TupleMatches(const MatcherTuple& matcher_tuple,
                  const ValueTuple& value_tuple) {
  // Makes sure that matcher_tuple and value_tuple have the same
  // number of fields.
  GTEST_COMPILE_ASSERT_(std::tuple_size<MatcherTuple>::value ==
                            std::tuple_size<ValueTuple>::value,
                        matcher_and_value_have_different_numbers_of_fields);
  return TuplePrefix<std::tuple_size<ValueTuple>::value>::Matches(matcher_tuple,
                                                                  value_tuple);
}